

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O2

void __thiscall QToolBarAreaLayout::apply(QToolBarAreaLayout *this,bool animate)

{
  QToolBarAreaLayoutItem *this_00;
  Representation RVar1;
  int iVar2;
  QToolBarAreaLayoutItem *pQVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [16];
  QRect QVar6;
  QRect QVar7;
  bool bVar8;
  LayoutDirection direction;
  int iVar9;
  Representation RVar10;
  QMainWindowLayout *pQVar11;
  undefined4 extraout_var;
  QWidget *this_01;
  QLayout *object;
  QToolBarLayout *this_02;
  QSize QVar12;
  long lVar13;
  Representation RVar14;
  QToolBarAreaLayoutLine *pQVar15;
  Representation RVar16;
  ulong uVar17;
  Representation *pRVar18;
  Representation RVar19;
  int k;
  ulong uVar20;
  QToolBarAreaLayoutLine *this_03;
  long lVar21;
  long in_FS_OFFSET;
  QSize local_50;
  undefined1 local_48 [8];
  Representation RStack_40;
  Representation RStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar11 = qt_mainwindow_layout(this->mainWindow);
  direction = QWidget::layoutDirection(&this->mainWindow->super_QWidget);
  for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
    for (uVar17 = 0; uVar17 < (ulong)this->docks[lVar13].lines.d.size; uVar17 = uVar17 + 1) {
      this_03 = this->docks[lVar13].lines.d.ptr + uVar17;
      bVar8 = QToolBarAreaLayoutLine::skip(this_03);
      if (!bVar8) {
        lVar21 = 0;
        for (uVar20 = 0; uVar20 < (ulong)(this_03->toolBarItems).d.size; uVar20 = uVar20 + 1) {
          pQVar3 = (this_03->toolBarItems).d.ptr;
          this_00 = (QToolBarAreaLayoutItem *)((long)&pQVar3->widgetItem + lVar21);
          bVar8 = QToolBarAreaLayoutItem::skip(this_00);
          if ((!bVar8) && ((&pQVar3->gap)[lVar21] == false)) {
            _local_48 = ZEXT412(0xffffffff) << 0x40;
            RStack_3c.m_i = -1;
            if (this->visible == true) {
              if (this_03->o == Horizontal) {
                auVar4._4_4_ = RStack_40.m_i;
                auVar4._8_4_ = RStack_3c.m_i;
                auVar4._0_4_ = (this_03->rect).y1.m_i;
                _local_48 = auVar4 << 0x20;
                RStack_3c.m_i = (this_03->rect).y2.m_i;
                iVar9 = *(int *)((long)&pQVar3->pos + lVar21);
                local_48._0_4_ = (this_03->rect).x1.m_i + iVar9;
                pRVar18 = &RStack_40;
                pQVar15 = this_03;
              }
              else {
                RVar1.m_i = (this_03->rect).x1.m_i;
                local_48._0_4_ = RVar1.m_i;
                RStack_40.m_i = (this_03->rect).x2.m_i;
                RStack_3c.m_i = -1;
                iVar9 = *(int *)((long)&pQVar3->pos + lVar21);
                local_48._4_4_ = (this_03->rect).y1.m_i + iVar9;
                pRVar18 = &RStack_3c;
                pQVar15 = (QToolBarAreaLayoutLine *)&(this_03->rect).y1;
              }
              pRVar18->m_i = iVar9 + (pQVar15->rect).x1.m_i + *(int *)((long)&pQVar3->size + lVar21)
                             + -1;
            }
            iVar9 = (*this_00->widgetItem->_vptr_QLayoutItem[0xd])();
            this_01 = &QtPrivate::qobject_cast_helper<QToolBar*,QObject>
                                 ((QObject *)CONCAT44(extraout_var,iVar9))->super_QWidget;
            if (this_01 != (QWidget *)0x0) {
              object = QWidget::layout(this_01);
              this_02 = QtPrivate::qobject_cast_helper<QToolBarLayout*,QObject>
                                  (&object->super_QObject);
              if ((this_02->super_QLayout).super_QLayoutItem.field_0xc == '\x01') {
                RVar16.m_i = RStack_40.m_i;
                RVar19.m_i = local_48._4_4_;
                local_50.wd.m_i = (RStack_40.m_i - local_48._0_4_) + 1;
                local_50.ht.m_i = (RStack_3c.m_i - local_48._4_4_) + 1;
                QVar12 = QToolBarLayout::expandedSize(this_02,&local_50);
                RVar10.m_i = (RVar16.m_i - QVar12.wd.m_i) + 1;
                local_48._0_4_ = RVar10.m_i;
                _local_48 = CONCAT48(RVar16.m_i,local_48);
                RVar14.m_i = QVar12.ht.m_i.m_i + -1 + RVar19.m_i;
                RStack_3c.m_i = RVar14.m_i;
                local_48 = (undefined1  [8])CONCAT44(RVar19.m_i,local_48._0_4_);
                RVar1.m_i = (this->rect).y2.m_i;
                if (RVar1.m_i < RVar14.m_i) {
                  RVar19.m_i = (RVar1.m_i - QVar12.ht.m_i) + 1;
                  local_48._4_4_ = RVar19.m_i;
                  RStack_3c.m_i = RVar1.m_i;
                  RVar14.m_i = RVar1.m_i;
                }
                QVar6 = _local_48;
                iVar2 = (this->rect).x2.m_i;
                if (iVar2 < RVar16.m_i) {
                  RVar10.m_i = RVar10.m_i + (iVar2 - RVar16.m_i);
                  local_48._0_4_ = RVar10.m_i;
                  QVar7 = _local_48;
                  RStack_3c = QVar6.y2.m_i;
                  local_48 = QVar7._0_8_;
                  RStack_40.m_i = iVar2;
                  RVar16.m_i = iVar2;
                }
                if (RVar10.m_i < 0) {
                  RStack_40.m_i = RVar16.m_i - RVar10.m_i;
                  auVar5._12_4_ = 0;
                  auVar5._0_12_ = stack0xffffffffffffffbc;
                  _local_48 = (QRect)(auVar5 << 0x20);
                }
                QVar6 = _local_48;
                if (RVar19.m_i < 0) {
                  RStack_3c.m_i = RVar14.m_i - RVar19.m_i;
                  local_48._0_4_ = QVar6.x1.m_i;
                  local_48._4_4_ = 0;
                }
              }
            }
            if ((this->visible == true) && (this->docks[lVar13].o == Horizontal)) {
              _local_48 = QStyle::visualRect(direction,&this_03->rect,(QRect *)local_48);
            }
            QWidgetAnimator::animate
                      ((QWidgetAnimator *)&pQVar11->widgetAnimator,
                       (QWidget *)CONCAT44(extraout_var,iVar9),(QRect *)local_48,animate);
          }
          lVar21 = lVar21 + 0x18;
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QToolBarAreaLayout::apply(bool animate)
{
    QMainWindowLayout *layout = qt_mainwindow_layout(mainWindow);
    Q_ASSERT(layout != nullptr);

    Qt::LayoutDirection dir = mainWindow->layoutDirection();

    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QToolBarAreaLayoutInfo &dock = docks[i];

        for (int j = 0; j < dock.lines.size(); ++j) {
            const QToolBarAreaLayoutLine &line = dock.lines.at(j);
            if (line.skip())
                continue;

            for (int k = 0; k < line.toolBarItems.size(); ++k) {
                const QToolBarAreaLayoutItem &item = line.toolBarItems.at(k);
                if (item.skip() || item.gap)
                    continue;

                QRect geo;
                if (visible) {
                    if (line.o == Qt::Horizontal) {
                        geo.setTop(line.rect.top());
                        geo.setBottom(line.rect.bottom());
                        geo.setLeft(line.rect.left() + item.pos);
                        geo.setRight(line.rect.left() + item.pos + item.size - 1);
                    } else {
                        geo.setLeft(line.rect.left());
                        geo.setRight(line.rect.right());
                        geo.setTop(line.rect.top() + item.pos);
                        geo.setBottom(line.rect.top() + item.pos + item.size - 1);
                    }
                }

                QWidget *widget = item.widgetItem->widget();
                if (QToolBar *toolBar = qobject_cast<QToolBar*>(widget)) {
                    QToolBarLayout *tbl = qobject_cast<QToolBarLayout*>(toolBar->layout());
                    if (tbl->expanded) {
                        QPoint tr = geo.topRight();
                        QSize size = tbl->expandedSize(geo.size());
                        geo.setSize(size);
                        geo.moveTopRight(tr);
                        if (geo.bottom() > rect.bottom())
                            geo.moveBottom(rect.bottom());
                        if (geo.right() > rect.right())
                            geo.moveRight(rect.right());
                        if (geo.left() < 0)
                            geo.moveLeft(0);
                        if (geo.top() < 0)
                            geo.moveTop(0);
                    }
                }

                if (visible && dock.o == Qt::Horizontal)
                    geo = QStyle::visualRect(dir, line.rect, geo);

                layout->widgetAnimator.animate(widget, geo, animate);
            }
        }
    }
}